

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.c
# Opt level: O3

void test_bson_utf8_nil(void)

{
  char cVar1;
  int iVar2;
  byte *pbVar3;
  int *piVar4;
  long *plVar5;
  char *pcVar6;
  uchar *puVar7;
  size_t sVar8;
  uint uVar9;
  char *unaff_RBX;
  char **ppcVar10;
  int iStack_2c;
  short sStack_26;
  char cStack_24;
  code *pcStack_20;
  code *pcStack_18;
  code *pcStack_10;
  
  pcStack_10 = (code *)0x137112;
  cVar1 = bson_utf8_validate("a",3,1);
  if (cVar1 == '\0') {
    pcStack_10 = (code *)0x1371ab;
    test_bson_utf8_nil_cold_1();
LAB_001371ab:
    pcStack_10 = (code *)0x1371b0;
    test_bson_utf8_nil_cold_4();
LAB_001371b0:
    pcStack_10 = (code *)0x1371b8;
    test_bson_utf8_nil_cold_2();
  }
  else {
    pcStack_10 = (code *)0x13712d;
    cVar1 = bson_utf8_validate("a",3,0);
    if (cVar1 != '\0') goto LAB_001371ab;
    pcStack_10 = (code *)0x137144;
    pbVar3 = (byte *)bson_utf8_escape_for_json("a",0xffffffffffffffff);
    if (pbVar3 != (byte *)0x14c71a) {
      uVar9 = *pbVar3 - 0x61;
      if (uVar9 == 0) {
        uVar9 = (uint)pbVar3[1];
      }
      if (uVar9 == 0) goto LAB_00137162;
      goto LAB_001371b0;
    }
LAB_00137162:
    pcStack_10 = (code *)0x13716a;
    bson_free(pbVar3);
    pcStack_10 = (code *)0x13717b;
    unaff_RBX = (char *)bson_utf8_escape_for_json("a",3);
    if (unaff_RBX == "a\\u0000b") {
LAB_0013719d:
      bson_free(unaff_RBX);
      return;
    }
    pcStack_10 = (code *)0x137199;
    iVar2 = strcmp("a\\u0000b",unaff_RBX);
    if (iVar2 == 0) goto LAB_0013719d;
  }
  pcStack_10 = test_bson_utf8_escape_for_json;
  test_bson_utf8_nil_cold_3();
  pcStack_18 = (code *)0x1371d2;
  pcStack_10 = (code *)unaff_RBX;
  piVar4 = (int *)bson_utf8_escape_for_json("my",6);
  if (*(int *)((long)piVar4 + 3) == 0x30303075 && *piVar4 == 0x755c796d) {
    unaff_RBX = (char *)0x79656b225c796d;
    pcStack_18 = (code *)0x1371fb;
    bson_free(piVar4);
    pcStack_18 = (code *)0x13720c;
    plVar5 = (long *)bson_utf8_escape_for_json("my\"key",6);
    if (*plVar5 != 0x79656b225c796d) goto LAB_001372a7;
    pcStack_18 = (code *)0x13721d;
    bson_free(plVar5);
    pcStack_18 = (code *)0x13722e;
    plVar5 = (long *)bson_utf8_escape_for_json("my\\key",6);
    unaff_RBX = (char *)0x79656b5c5c796d;
    if (*plVar5 != 0x79656b5c5c796d) goto LAB_001372ac;
    pcStack_18 = (code *)0x137242;
    bson_free(plVar5);
    pcStack_18 = (code *)0x137255;
    plVar5 = (long *)bson_utf8_escape_for_json("\\\"\\\"",0xffffffffffffffff);
    if ((char)plVar5[1] != '\0' || *plVar5 != 0x225c5c5c225c5c5c) goto LAB_001372b1;
    pcStack_18 = (code *)0x137273;
    bson_free(plVar5);
    pcStack_18 = (code *)0x137286;
    piVar4 = (int *)bson_utf8_escape_for_json("\x0e",0xffffffffffffffff);
    if (*(int *)((long)piVar4 + 3) == 0x653030 && *piVar4 == 0x3030755c) {
      bson_free(piVar4);
      return;
    }
  }
  else {
    pcStack_18 = (code *)0x1372a7;
    test_bson_utf8_escape_for_json_cold_1();
LAB_001372a7:
    pcStack_18 = (code *)0x1372ac;
    test_bson_utf8_escape_for_json_cold_2();
LAB_001372ac:
    pcStack_18 = (code *)0x1372b1;
    test_bson_utf8_escape_for_json_cold_3();
LAB_001372b1:
    pcStack_18 = (code *)0x1372b6;
    test_bson_utf8_escape_for_json_cold_4();
  }
  pcStack_18 = test_bson_utf8_get_char;
  test_bson_utf8_escape_for_json_cold_5();
  pcStack_20 = (code *)0x1372c8;
  pcStack_18 = (code *)unaff_RBX;
  iVar2 = bson_utf8_get_char("asdf");
  if (iVar2 == 0x61) {
    pcStack_20 = (code *)0x1372dd;
    unaff_RBX = (char *)bson_utf8_next_char("asdf");
    pcStack_20 = (code *)0x1372e8;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x73) goto LAB_001373e6;
    pcStack_20 = (code *)0x1372f9;
    unaff_RBX = (char *)bson_utf8_next_char(unaff_RBX);
    pcStack_20 = (code *)0x137304;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 100) goto LAB_001373eb;
    pcStack_20 = (code *)0x137315;
    unaff_RBX = (char *)bson_utf8_next_char(unaff_RBX);
    pcStack_20 = (code *)0x137320;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x66) goto LAB_001373f0;
    pcStack_20 = (code *)0x137331;
    pcVar6 = (char *)bson_utf8_next_char(unaff_RBX);
    if (*pcVar6 != '\0') goto LAB_001373f5;
    pcStack_20 = (code *)0x137346;
    iVar2 = bson_utf8_get_char(test_bson_utf8_get_char::test2);
    if (iVar2 != 0x20ac) goto LAB_001373fa;
    pcStack_20 = (code *)0x13735d;
    puVar7 = (uchar *)bson_utf8_next_char(test_bson_utf8_get_char::test2);
    if (puVar7 != test_bson_utf8_get_char::test2 + 3) goto LAB_001373ff;
    pcStack_20 = (code *)0x137379;
    iVar2 = bson_utf8_get_char(test_bson_utf8_get_char::test2 + 3);
    if (iVar2 != 0x20) goto LAB_00137404;
    pcStack_20 = (code *)0x13738e;
    unaff_RBX = (char *)bson_utf8_next_char(test_bson_utf8_get_char::test2 + 3);
    pcStack_20 = (code *)0x137399;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x20ac) goto LAB_00137409;
    pcStack_20 = (code *)0x1373a8;
    unaff_RBX = (char *)bson_utf8_next_char(unaff_RBX);
    pcStack_20 = (code *)0x1373b3;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x20) goto LAB_0013740e;
    pcStack_20 = (code *)0x1373c0;
    unaff_RBX = (char *)bson_utf8_next_char(unaff_RBX);
    pcStack_20 = (code *)0x1373cb;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x20ac) goto LAB_00137413;
    pcStack_20 = (code *)0x1373da;
    pcVar6 = (char *)bson_utf8_next_char(unaff_RBX);
    if (*pcVar6 == '\0') {
      return;
    }
  }
  else {
    pcStack_20 = (code *)0x1373e6;
    test_bson_utf8_get_char_cold_1();
LAB_001373e6:
    pcStack_20 = (code *)0x1373eb;
    test_bson_utf8_get_char_cold_2();
LAB_001373eb:
    pcStack_20 = (code *)0x1373f0;
    test_bson_utf8_get_char_cold_3();
LAB_001373f0:
    pcStack_20 = (code *)0x1373f5;
    test_bson_utf8_get_char_cold_4();
LAB_001373f5:
    pcStack_20 = (code *)0x1373fa;
    test_bson_utf8_get_char_cold_5();
LAB_001373fa:
    pcStack_20 = (code *)0x1373ff;
    test_bson_utf8_get_char_cold_6();
LAB_001373ff:
    pcStack_20 = (code *)0x137404;
    test_bson_utf8_get_char_cold_7();
LAB_00137404:
    pcStack_20 = (code *)0x137409;
    test_bson_utf8_get_char_cold_8();
LAB_00137409:
    pcStack_20 = (code *)0x13740e;
    test_bson_utf8_get_char_cold_9();
LAB_0013740e:
    pcStack_20 = (code *)0x137413;
    test_bson_utf8_get_char_cold_10();
LAB_00137413:
    pcStack_20 = (code *)0x137418;
    test_bson_utf8_get_char_cold_11();
  }
  pcStack_20 = test_bson_utf8_from_unichar;
  test_bson_utf8_get_char_cold_12();
  pcStack_20 = (code *)unaff_RBX;
  bson_utf8_from_unichar(0,&sStack_26,&iStack_2c);
  if (iStack_2c == 1) {
    bson_utf8_from_unichar(0x80,&sStack_26,&iStack_2c);
    if (iStack_2c != 2) goto LAB_001376dc;
    bson_utf8_from_unichar(0x800,&sStack_26,&iStack_2c);
    if (iStack_2c != 3) goto LAB_001376e1;
    bson_utf8_from_unichar(0x10000,&sStack_26,&iStack_2c);
    if (iStack_2c != 4) goto LAB_001376e6;
    bson_utf8_from_unichar(0x200000,&sStack_26,&iStack_2c);
    if (iStack_2c != 5) goto LAB_001376eb;
    bson_utf8_from_unichar(0x4000000,&sStack_26,&iStack_2c);
    if (iStack_2c != 6) goto LAB_001376f0;
    bson_utf8_from_unichar(0x7f,&sStack_26,&iStack_2c);
    if (iStack_2c != 1) goto LAB_001376f5;
    bson_utf8_from_unichar(0x7ff,&sStack_26,&iStack_2c);
    if (iStack_2c != 2) goto LAB_001376fa;
    bson_utf8_from_unichar(0xffff,&sStack_26,&iStack_2c);
    if (iStack_2c != 3) goto LAB_001376ff;
    bson_utf8_from_unichar(0x1fffff,&sStack_26,&iStack_2c);
    if (iStack_2c != 4) goto LAB_00137704;
    bson_utf8_from_unichar(0x3ffffff,&sStack_26,&iStack_2c);
    if (iStack_2c != 5) goto LAB_00137709;
    bson_utf8_from_unichar(0x7fffffff,&sStack_26,&iStack_2c);
    if (iStack_2c != 6) goto LAB_0013770e;
    bson_utf8_from_unichar(0xd7ff,&sStack_26,&iStack_2c);
    if (iStack_2c != 3) goto LAB_00137713;
    bson_utf8_from_unichar(0xe000,&sStack_26,&iStack_2c);
    if (iStack_2c != 3) goto LAB_00137718;
    bson_utf8_from_unichar(0xfffd,&sStack_26,&iStack_2c);
    if (iStack_2c != 3) goto LAB_0013771d;
    bson_utf8_from_unichar(0x10ffff,&sStack_26,&iStack_2c);
    if (iStack_2c != 4) goto LAB_00137722;
    bson_utf8_from_unichar(0x110000,&sStack_26,&iStack_2c);
    if (iStack_2c != 4) goto LAB_00137727;
    bson_utf8_from_unichar(0x61,&sStack_26,&iStack_2c);
    if (iStack_2c != 1) goto LAB_0013772c;
    if ((char)sStack_26 != 'a') goto LAB_00137731;
    bson_utf8_from_unichar(0xff,&sStack_26,&iStack_2c);
    if (iStack_2c != 2) goto LAB_00137736;
    if (sStack_26 != -0x403d) goto LAB_0013773b;
    bson_utf8_from_unichar(0x20ac,&sStack_26,&iStack_2c);
    if (iStack_2c == 3) {
      if (cStack_24 == -0x54 && sStack_26 == -0x7d1e) {
        return;
      }
      goto LAB_00137745;
    }
  }
  else {
    test_bson_utf8_from_unichar_cold_1();
LAB_001376dc:
    test_bson_utf8_from_unichar_cold_2();
LAB_001376e1:
    test_bson_utf8_from_unichar_cold_3();
LAB_001376e6:
    test_bson_utf8_from_unichar_cold_4();
LAB_001376eb:
    test_bson_utf8_from_unichar_cold_5();
LAB_001376f0:
    test_bson_utf8_from_unichar_cold_6();
LAB_001376f5:
    test_bson_utf8_from_unichar_cold_7();
LAB_001376fa:
    test_bson_utf8_from_unichar_cold_8();
LAB_001376ff:
    test_bson_utf8_from_unichar_cold_9();
LAB_00137704:
    test_bson_utf8_from_unichar_cold_10();
LAB_00137709:
    test_bson_utf8_from_unichar_cold_11();
LAB_0013770e:
    test_bson_utf8_from_unichar_cold_12();
LAB_00137713:
    test_bson_utf8_from_unichar_cold_13();
LAB_00137718:
    test_bson_utf8_from_unichar_cold_14();
LAB_0013771d:
    test_bson_utf8_from_unichar_cold_15();
LAB_00137722:
    test_bson_utf8_from_unichar_cold_16();
LAB_00137727:
    test_bson_utf8_from_unichar_cold_17();
LAB_0013772c:
    test_bson_utf8_from_unichar_cold_18();
LAB_00137731:
    test_bson_utf8_from_unichar_cold_19();
LAB_00137736:
    test_bson_utf8_from_unichar_cold_20();
LAB_0013773b:
    test_bson_utf8_from_unichar_cold_21();
  }
  test_bson_utf8_from_unichar_cold_22();
LAB_00137745:
  test_bson_utf8_from_unichar_cold_23();
  ppcVar10 = test_bson_utf8_non_shortest::tests;
  puVar7 = (uchar *)0x0;
  do {
    pcVar6 = *ppcVar10;
    sVar8 = strlen(pcVar6);
    cVar1 = bson_utf8_validate(pcVar6,sVar8,0);
    if (cVar1 != '\0') {
      test_bson_utf8_non_shortest_cold_2();
      goto LAB_001377a9;
    }
    puVar7 = (uchar *)((long)&((TestSuite *)puVar7)->prgname + 1);
    ppcVar10 = ppcVar10 + 1;
  } while ((TestSuite *)puVar7 != (TestSuite *)0x5);
  puVar7 = test_bson_utf8_validate::test2;
  cVar1 = bson_utf8_validate(test_bson_utf8_validate::test2,2,1);
  if (cVar1 != '\0') {
    return;
  }
LAB_001377a9:
  test_bson_utf8_non_shortest_cold_1();
  TestSuite_Add((TestSuite *)puVar7,"/bson/value/basic",test_value_basic);
  TestSuite_Add((TestSuite *)puVar7,"/bson/value/decimal128",test_value_decimal128);
  return;
}

Assistant:

static void
test_bson_utf8_nil (void)
{
   static const unsigned char test[] = {'a', 0, 'b', 0};
   char *str;

   BSON_ASSERT (bson_utf8_validate ((const char *) test, 3, true));
   BSON_ASSERT (!bson_utf8_validate ((const char *) test, 3, false));

   /* no length provided, stop at first nil */
   str = bson_utf8_escape_for_json ((const char *) test, -1);
   ASSERT_CMPSTR ("a", str);
   bson_free (str);

   str = bson_utf8_escape_for_json ((const char *) test, 3);
   ASSERT_CMPSTR ("a\\u0000b", str);
   bson_free (str);
}